

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# second_order_all_pass_frequency_transform.cc
# Opt level: O1

void __thiscall
sptk::SecondOrderAllPassFrequencyTransform::SecondOrderAllPassFrequencyTransform
          (SecondOrderAllPassFrequencyTransform *this,int num_input_order,int num_output_order,
          int fft_length,double alpha,double theta)

{
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  pointer pdVar4;
  pointer pvVar5;
  bool bVar6;
  double *pdVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  ulong __n;
  size_type __n_00;
  ulong uVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  InverseFastFourierTransform inverse_fourier_transform;
  vector<double,_std::allocator<double>_> ww;
  vector<double,_std::allocator<double>_> dw;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  real;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  imag;
  InverseFastFourierTransform local_140;
  vector<double,_std::allocator<double>_> local_108;
  vector<double,_std::allocator<double>_> local_f0;
  double local_d8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_c0;
  double local_a8;
  double local_98;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_90;
  double local_78;
  double dStack_70;
  undefined1 local_68 [16];
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  this->_vptr_SecondOrderAllPassFrequencyTransform =
       (_func_int **)&PTR__SecondOrderAllPassFrequencyTransform_0011a748;
  this->num_input_order_ = num_input_order;
  this->num_output_order_ = num_output_order;
  this->alpha_ = alpha;
  this->theta_ = theta;
  this->is_valid_ = true;
  (this->conversion_matrix_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->conversion_matrix_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->conversion_matrix_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (num_input_order < fft_length && -1 < (num_output_order | num_input_order)) {
    this_00 = &this->conversion_matrix_;
    local_a8 = alpha;
    bVar6 = IsValidAlpha(alpha);
    if ((bVar6) && (bVar6 = IsInRange(this->theta_,0.0,3.141592653589793), bVar6)) {
      iVar1 = this->num_input_order_;
      iVar2 = this->num_output_order_;
      __n = (ulong)(uint)fft_length;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_140,__n,
                 (allocator_type *)&local_90);
      __n_00 = (long)iVar2 + 1;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::vector(&local_c0,__n_00,(value_type *)&local_140,(allocator_type *)&local_108);
      if (local_140._vptr_InverseFastFourierTransform != (_func_int **)0x0) {
        operator_delete(local_140._vptr_InverseFastFourierTransform);
      }
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_140,__n,
                 (allocator_type *)&local_108);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::vector(&local_90,__n_00,(value_type *)&local_140,(allocator_type *)&local_f0);
      if (local_140._vptr_InverseFastFourierTransform != (_func_int **)0x0) {
        operator_delete(local_140._vptr_InverseFastFourierTransform);
      }
      std::vector<double,_std::allocator<double>_>::vector
                (&local_108,__n,(allocator_type *)&local_140);
      std::vector<double,_std::allocator<double>_>::vector
                (&local_f0,__n,(allocator_type *)&local_140);
      if (0 < fft_length) {
        local_98 = 6.283185307179586 / (double)fft_length;
        local_58 = local_a8 * local_a8;
        local_68._8_4_ = SUB84(local_a8,0);
        local_68._0_8_ = local_a8;
        local_68._12_4_ = (int)((ulong)local_a8 >> 0x20);
        local_78 = -local_58;
        dStack_70 = -local_58;
        local_48 = -(local_a8 + local_a8);
        dStack_40 = -(local_a8 + local_a8);
        uVar12 = 0;
        dStack_50 = local_58;
        do {
          dVar13 = (double)(int)uVar12 * local_98;
          dVar14 = Warp(dVar13,local_a8,theta);
          local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar12] = dVar14;
          local_d8 = cos(dVar13 - theta);
          dVar13 = cos(dVar13 + theta);
          auVar15._0_8_ = (double)local_68._0_8_ * local_d8 + local_78;
          auVar15._8_8_ = (double)local_68._8_8_ * dVar13 + dStack_70;
          dVar13 = dVar13 * dStack_40 + 1.0 + dStack_50;
          auVar16._8_4_ = SUB84(dVar13,0);
          auVar16._0_8_ = local_d8 * local_48 + 1.0 + local_58;
          auVar16._12_4_ = (int)((ulong)dVar13 >> 0x20);
          auVar16 = divpd(auVar15,auVar16);
          local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar12] = auVar16._8_8_ + auVar16._0_8_ + 1.0;
          uVar12 = uVar12 + 1;
        } while (__n != uVar12);
      }
      local_d8 = (double)(long)iVar1;
      InverseFastFourierTransform::InverseFastFourierTransform(&local_140,fft_length);
      if (-1 < this->num_output_order_) {
        uVar11 = (uint)this->num_output_order_ >> 0x1f;
        lVar8 = 0;
        do {
          if (0 < fft_length) {
            uVar12 = 0;
            do {
              dVar13 = cos(local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar12] * (double)(int)lVar8);
              local_c0.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar8].
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar12] =
                   dVar13 * local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar12];
              dVar13 = sin(local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar12] * (double)(int)lVar8);
              local_90.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar8].
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar12] =
                   -dVar13 * local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar12];
              uVar12 = uVar12 + 1;
            } while (__n != uVar12);
          }
          bVar6 = InverseFastFourierTransform::Run
                            (&local_140,
                             local_c0.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar8,
                             local_90.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar8);
          if (!bVar6) {
            this->is_valid_ = false;
            local_140._vptr_InverseFastFourierTransform =
                 (_func_int **)&PTR__InverseFastFourierTransform_0011a868;
            local_140.fast_fourier_transform_._vptr_FastFourierTransform =
                 (_func_int **)&PTR__FastFourierTransform_0011a7d8;
            if (local_140.fast_fourier_transform_.sine_table_.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start != (pointer)0x0) {
              operator_delete(local_140.fast_fourier_transform_.sine_table_.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
            if (local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
            if (local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
            dVar13 = local_d8;
            if (uVar11 == 0) goto LAB_0010b04c;
            goto LAB_0010af6b;
          }
          uVar11 = this->num_input_order_;
          if (0 < (int)uVar11) {
            pdVar4 = local_c0.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar8].
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar7 = pdVar4 + (long)fft_length + -1;
            lVar9 = 1;
            do {
              pdVar4[lVar9] = *pdVar7 + pdVar4[lVar9];
              lVar9 = lVar9 + 1;
              pdVar7 = pdVar7 + -1;
            } while ((ulong)uVar11 + 1 != lVar9);
          }
          uVar11 = (uint)(this->num_output_order_ <= lVar8);
          bVar6 = lVar8 < this->num_output_order_;
          lVar8 = lVar8 + 1;
        } while (bVar6);
      }
      local_140._vptr_InverseFastFourierTransform =
           (_func_int **)&PTR__InverseFastFourierTransform_0011a868;
      local_140.fast_fourier_transform_._vptr_FastFourierTransform =
           (_func_int **)&PTR__FastFourierTransform_0011a7d8;
      if (local_140.fast_fourier_transform_.sine_table_.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_140.fast_fourier_transform_.sine_table_.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      dVar13 = local_d8;
      if (local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
LAB_0010af6b:
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize(this_00,__n_00);
      uVar11 = this->num_output_order_;
      if (-1 < (int)uVar11) {
        lVar8 = 0;
        do {
          std::vector<double,_std::allocator<double>_>::resize
                    ((this_00->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + lVar8,(long)dVar13 + 1);
          uVar11 = this->num_input_order_;
          if (-1 < (int)uVar11) {
            pdVar4 = local_c0.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar8].
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar9 = *(long *)&(this_00->
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[lVar8].
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data;
            lVar10 = 0;
            do {
              *(double *)(lVar9 + lVar10 * 8) = pdVar4[lVar10];
              lVar10 = lVar10 + 1;
            } while ((ulong)uVar11 + 1 != lVar10);
          }
          uVar11 = this->num_output_order_;
          bVar6 = lVar8 < (int)uVar11;
          lVar8 = lVar8 + 1;
        } while (bVar6);
      }
      uVar3 = this->num_input_order_;
      if (0 < (int)uVar3) {
        lVar8 = *(long *)&(((this_00->
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data;
        lVar9 = 1;
        do {
          *(double *)(lVar8 + lVar9 * 8) = *(double *)(lVar8 + lVar9 * 8) * 0.5;
          lVar9 = lVar9 + 1;
        } while ((ulong)uVar3 + 1 != lVar9);
      }
      if (0 < (int)uVar11) {
        pvVar5 = (this_00->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar8 = 0x18;
        do {
          pdVar7 = *(double **)
                    ((long)&(pvVar5->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data + lVar8);
          dVar13 = *pdVar7;
          *pdVar7 = dVar13 + dVar13;
          lVar8 = lVar8 + 0x18;
        } while ((ulong)uVar11 * 0x18 + 0x18 != lVar8);
      }
LAB_0010b04c:
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(&local_90);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(&local_c0);
      return;
    }
  }
  this->is_valid_ = false;
  return;
}

Assistant:

SecondOrderAllPassFrequencyTransform::SecondOrderAllPassFrequencyTransform(
    int num_input_order, int num_output_order, int fft_length, double alpha,
    double theta)
    : num_input_order_(num_input_order),
      num_output_order_(num_output_order),
      alpha_(alpha),
      theta_(theta),
      is_valid_(true) {
  if (num_input_order_ < 0 || num_output_order_ < 0 ||
      fft_length <= num_input_order_ || !sptk::IsValidAlpha(alpha_) ||
      !sptk::IsInRange(theta_, 0.0, sptk::kPi)) {
    is_valid_ = false;
    return;
  }

  const int input_length(num_input_order_ + 1);
  const int output_length(num_output_order_ + 1);
  std::vector<std::vector<double> > real(output_length,
                                         std::vector<double>(fft_length));
  std::vector<std::vector<double> > imag(output_length,
                                         std::vector<double>(fft_length));
  {
    std::vector<double> ww(fft_length);
    std::vector<double> dw(fft_length);
    {
      const double delta(sptk::kTwoPi / fft_length);
      for (int j(0); j < fft_length; ++j) {
        const double omega(delta * j);
        ww[j] = sptk::Warp(omega, alpha, theta);
        dw[j] = DiffWarp(omega, alpha, theta);
      }
    }

    sptk::InverseFastFourierTransform inverse_fourier_transform(fft_length);
    for (int m(0); m <= num_output_order_; ++m) {
      for (int j(0); j < fft_length; ++j) {
        real[m][j] = std::cos(ww[j] * m) * dw[j];
        imag[m][j] = -std::sin(ww[j] * m) * dw[j];
      }

      if (!inverse_fourier_transform.Run(&real[m], &imag[m])) {
        is_valid_ = false;
        return;
      }

      for (int j(1); j <= num_input_order_; ++j) {
        real[m][j] += real[m][fft_length - j];
      }
    }
  }

  conversion_matrix_.resize(output_length);
  for (int m2(0); m2 <= num_output_order_; ++m2) {
    conversion_matrix_[m2].resize(input_length);
    for (int m1(0); m1 <= num_input_order_; ++m1) {
      conversion_matrix_[m2][m1] = real[m2][m1];
    }
  }
  for (int m1(1); m1 <= num_input_order_; ++m1) {
    conversion_matrix_[0][m1] *= 0.5;
  }
  for (int m2(1); m2 <= num_output_order_; ++m2) {
    conversion_matrix_[m2][0] *= 2.0;
  }
}